

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O3

long __thiscall AmsRouter::AddRoute(AmsRouter *this,AmsNetId ams,string *host)

{
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  *this_00;
  long *plVar1;
  _Hash_node_base _Var2;
  mapped_type pAVar3;
  bool bVar4;
  AmsConnection *pAVar5;
  mapped_type *ppAVar6;
  _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
  _Var7;
  ulong uVar8;
  __node_base *p_Var9;
  pair<std::_Rb_tree_iterator<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::_Rb_tree_iterator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  pVar10;
  pair<std::__detail::_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>,_bool>
  pVar11;
  unique_lock<std::recursive_mutex> lock;
  AmsNetId local_70;
  AmsConnection *local_68;
  code *local_60;
  addrinfo *local_58;
  AmsNetId local_4e;
  undefined1 local_48 [16];
  char local_38 [16];
  
  local_70.b._0_4_ = ams.b._0_4_;
  local_70.b._4_2_ = ams.b._4_2_;
  local_48._0_8_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"48898","");
  bhf::ads::GetListOfAddresses((ads *)&local_60,host,(string *)local_48);
  if ((char *)local_48._0_8_ != local_38) {
    operator_delete((void *)local_48._0_8_);
  }
  local_48._0_8_ = &this->mutex;
  local_48[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_48);
  local_48[8] = true;
  AwaitConnectionAttempts(this,&local_70,(unique_lock<std::recursive_mutex> *)local_48);
  pAVar5 = GetConnection(this,&local_70);
  if (pAVar5 != (AmsConnection *)0x0) {
    bVar4 = AmsConnection::IsConnectedTo(pAVar5,local_58);
    uVar8 = 0x506;
    if (!bVar4) goto LAB_0012b75b;
  }
  p_Var9 = &(this->connections)._M_h._M_before_begin;
  do {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) {
      this_00 = &this->connection_attempts;
      std::
      map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
      ::operator[](this_00,&local_70);
      std::unique_lock<std::recursive_mutex>::unlock((unique_lock<std::recursive_mutex> *)local_48);
      pAVar5 = (AmsConnection *)operator_new(0x3918);
      AmsConnection::AmsConnection(pAVar5,&this->super_Router,local_58);
      local_68 = pAVar5;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_48);
      pVar10 = std::
               _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
               ::equal_range(&this_00->_M_t,&local_70);
      std::
      _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                    );
      std::_V2::condition_variable_any::notify_all(&this->connection_attempt_events);
      pVar11 = std::
               _Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::_M_emplace<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>
                         ((_Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)&this->connections,&local_68);
      _Var7 = pVar11.first.
              super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
              ._M_cur;
      uVar8 = 0xffffffffffffffff;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        bVar4 = AmsNetId::operator_cast_to_bool(&this->localAddr);
        if (!bVar4) {
          AmsNetId::AmsNetId(&local_4e,
                             *(uint32_t *)
                              (*(long *)((long)_Var7.
                                               super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                               ._M_cur + 8) + 0x3910));
          *(undefined2 *)((this->localAddr).b + 4) = local_4e.b._4_2_;
          *(undefined4 *)(this->localAddr).b = local_4e.b._0_4_;
        }
        LOCK();
        plVar1 = (long *)(*(long *)((long)_Var7.
                                          super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                          ._M_cur + 8) + 0xa8);
        *plVar1 = *plVar1 + 1;
        UNLOCK();
        pAVar3 = *(mapped_type *)
                  ((long)_Var7.
                         super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                         ._M_cur + 8);
        ppAVar6 = std::
                  map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
                  ::operator[](&this->mapping,&local_70);
        *ppAVar6 = pAVar3;
        uVar8 = (ulong)(*(int *)(*(long *)((long)_Var7.
                                                 super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                                 ._M_cur + 8) + 0x3910) == 0);
      }
      pAVar5 = local_68;
      if (local_68 != (AmsConnection *)0x0) {
        AmsConnection::~AmsConnection(local_68);
        operator_delete(pAVar5);
      }
      goto LAB_0012b75b;
    }
    bVar4 = AmsConnection::IsConnectedTo((AmsConnection *)p_Var9[1]._M_nxt,local_58);
  } while (!bVar4);
  LOCK();
  p_Var9[1]._M_nxt[0x15]._M_nxt =
       (_Hash_node_base *)((long)&(p_Var9[1]._M_nxt[0x15]._M_nxt)->_M_nxt + 1);
  UNLOCK();
  _Var2._M_nxt = p_Var9[1]._M_nxt;
  ppAVar6 = std::
            map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
            ::operator[](&this->mapping,&local_70);
  *ppAVar6 = (mapped_type)_Var2._M_nxt;
  uVar8 = 0;
LAB_0012b75b:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_48);
  if (local_58 != (addrinfo *)0x0) {
    (*local_60)();
  }
  return uVar8;
}

Assistant:

long AmsRouter::AddRoute(AmsNetId ams, const std::string& host)
{
    /**
        DNS lookups are pretty time consuming, we shouldn't do them
        with a looked mutex! So instead we do the lookup first and
        use the results, later.
     */
    auto hostAddresses = bhf::ads::GetListOfAddresses(host, "48898");

    std::unique_lock<std::recursive_mutex> lock(mutex);

    AwaitConnectionAttempts(ams, lock);

    const auto oldConnection = GetConnection(ams);
    if (oldConnection && !oldConnection->IsConnectedTo(hostAddresses.get())) {
        /**
           There is already a route for this AmsNetId, but with
           a different IP. The old route has to be deleted, first!
         */
        return ROUTERERR_PORTALREADYINUSE;
    }

    for (const auto& conn : connections) {
        if (conn->IsConnectedTo(hostAddresses.get())) {
            conn->refCount++;
            mapping[ams] = conn.get();
            return 0;
        }
    }

    connection_attempts[ams] = {};
    lock.unlock();

    try {
        auto new_connection = std::unique_ptr<AmsConnection>(new AmsConnection { *this, hostAddresses.get()});
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();

        auto conn = connections.emplace(std::move(new_connection));
        if (conn.second) {
            /** in case no local AmsNetId was set previously, we derive one */
            if (!localAddr) {
                localAddr = AmsNetId {conn.first->get()->ownIp};
            }
            conn.first->get()->refCount++;
            mapping[ams] = conn.first->get();
            return !conn.first->get()->ownIp;
        }

        return -1;
    } catch (std::exception& e) {
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();
        throw e;
    }
}